

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

int __thiscall QLayout::totalMinimumHeightForWidth(QLayout *this,int w)

{
  int iVar1;
  int iVar2;
  QLayoutPrivate *this_00;
  QWidgetPrivate *pQVar3;
  int in_ESI;
  long in_RDI;
  int h;
  QWidgetPrivate *wd;
  QWidget *parent;
  int top;
  int side;
  QLayoutPrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  QLayout *in_stack_ffffffffffffffd0;
  int local_20;
  int local_1c;
  long lVar4;
  
  lVar4 = in_RDI;
  this_00 = d_func((QLayout *)0x33dc50);
  iVar2 = (int)((ulong)lVar4 >> 0x20);
  local_1c = 0;
  local_20 = 0;
  if ((this_00->field_0x8c & 1) != 0) {
    parentWidget(in_stack_ffffffffffffffd0);
    QWidget::ensurePolished((QWidget *)this_00);
    pQVar3 = QWidget::d_func((QWidget *)0x33dc9d);
    local_1c = (int)pQVar3->leftmargin + (int)pQVar3->rightmargin;
    local_20 = (int)pQVar3->topmargin + (int)pQVar3->bottommargin;
  }
  iVar1 = (**(code **)(*(long *)(in_RDI + 0x10) + 0x58))(in_RDI + 0x10,in_ESI - local_1c);
  iVar1 = iVar1 + local_20;
  iVar2 = menuBarHeightForWidth((QWidget *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),iVar2);
  return iVar2 + iVar1;
}

Assistant:

int QLayout::totalMinimumHeightForWidth(int w) const
{
    Q_D(const QLayout);
    int side=0, top=0;
    if (d->topLevel) {
        QWidget *parent = parentWidget();
        parent->ensurePolished();
        QWidgetPrivate *wd = parent->d_func();
        side += wd->leftmargin + wd->rightmargin;
        top += wd->topmargin + wd->bottommargin;
    }
    int h = minimumHeightForWidth(w - side) + top;
#if QT_CONFIG(menubar)
    h += menuBarHeightForWidth(d->menubar, w);
#endif
    return h;
}